

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

bool __thiscall ODDLParser::OpenDDLParser::parse(OpenDDLParser *this)

{
  char *end;
  pointer pcVar1;
  Context *this_00;
  DDLNode *pDVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  string local_58;
  string local_38;
  
  if ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_006ac814:
    bVar5 = false;
  }
  else {
    normalizeBuffer(&this->m_buffer);
    this_00 = (Context *)operator_new(8);
    Context::Context(this_00);
    this->m_context = this_00;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"root","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    pDVar2 = DDLNode::create(&local_38,&local_58,(DDLNode *)0x0);
    this->m_context->m_root = pDVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    pushNode(this,this->m_context->m_root);
    pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    end = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    bVar5 = end == pcVar3;
    if (!bVar5) {
      do {
        pcVar3 = parseHeader(this,pcVar3,end);
        pcVar3 = parseStructure(this,pcVar3,end);
        if (pcVar3 == (char *)0x0) goto LAB_006ac814;
        pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar4 = (ulong)((long)pcVar3 - (long)pcVar1) <
                (ulong)((long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1);
        bVar5 = !bVar4;
      } while (bVar4);
    }
  }
  return bVar5;
}

Assistant:

const char *OpenDDLParser::getVersion() {
    return Version;
}